

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchSolve.cpp
# Opt level: O0

bool Bmatch_GetGuess(vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     *f,vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                        *g,vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                           *fo,
                    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                    *gi,PI_PO_INFO *pInformation,METHOD method)

{
  pointer *pppsVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *this;
  int *piVar8;
  suppWrap *psVar9;
  size_type sVar10;
  reference ppsVar11;
  int local_1b4;
  byte local_181;
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> local_180;
  int local_160;
  int local_15c;
  int m_1;
  int j_1;
  int n_2;
  int i_2;
  suppWrap **local_130;
  __normal_iterator<suppWrap_**,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> local_128;
  const_iterator local_120;
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> local_118;
  int local_f8;
  int local_f4;
  int l;
  int k;
  int m;
  int j;
  int local_e0;
  int local_dc;
  int n_1;
  int i_1;
  __normal_iterator<suppWrap_**,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> local_c0;
  const_iterator local_b8;
  int local_ac;
  int local_a8;
  int n;
  int i;
  int local_9c;
  bool notGood;
  bool save;
  bool findPair;
  bool done;
  int currentIndex;
  int poCap;
  int piCap;
  suppWrap *tmpW;
  suppWrap *tmpWrap2;
  suppWrap *tmpWrap1;
  vector<suppWrap_*,_std::allocator<suppWrap_*>_> mapNodes;
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> tmpPair;
  METHOD method_local;
  PI_PO_INFO *pInformation_local;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *gi_local;
  vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
  *fo_local;
  vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
  *g_local;
  vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
  *f_local;
  
  bVar3 = std::
          vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
          ::empty(f);
  local_181 = 0;
  if (!bVar3) {
    bVar3 = std::
            vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
            ::empty(g);
    local_181 = bVar3 ^ 0xff;
  }
  if ((local_181 & 1) == 0) {
    __assert_fail("!f.empty() && !g.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchSolve.cpp"
                  ,0x77,
                  "bool Bmatch_GetGuess(vector<vector<suppWrap *>> &, vector<vector<suppWrap *>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, vector<pair<suppWrap *, vector<suppWrap *>>> &, PI_PO_INFO *, METHOD)"
                 );
  }
  std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::
  pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_true>
            ((pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> *)
             &mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::vector
            ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
  currentIndex = 3;
  _notGood = 1;
  local_9c = 0;
  i._3_1_ = 0;
  i._2_1_ = 0;
  i._1_1_ = 0;
  i._0_1_ = 0;
  if (method == M_ONE_TO_ONE) {
    while (((i._2_1_ ^ 0xff) & 1) != 0) {
      sVar10 = (size_type)local_9c;
      sVar4 = std::
              vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
              ::size(f);
      if (sVar10 == sVar4) {
        f_local._7_1_ = false;
        goto LAB_00a50e19;
      }
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 ::operator[](f,(long)local_9c);
        bVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::empty(pvVar5);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        pvVar5 = std::
                 vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 ::operator[](f,(long)local_9c);
        ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[](pvVar5,0);
        tmpW = *ppsVar11;
        local_a8 = 0;
        sVar10 = std::
                 vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                 ::size(&pInformation->_f_match);
        local_ac = (int)sVar10;
        for (; psVar9 = tmpW, local_a8 < local_ac; local_a8 = local_a8 + 1) {
          pvVar6 = std::
                   vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                   ::operator[](&pInformation->_f_match,(long)local_a8);
          if (psVar9 == pvVar6->first) {
            pvVar5 = std::
                     vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     ::operator[](f,(long)local_9c);
            pvVar7 = std::
                     vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     ::operator[](f,(long)local_9c);
            local_c0._M_current =
                 (suppWrap **)std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::begin(pvVar7);
            __gnu_cxx::
            __normal_iterator<suppWrap*const*,std::vector<suppWrap*,std::allocator<suppWrap*>>>::
            __normal_iterator<suppWrap**>
                      ((__normal_iterator<suppWrap*const*,std::vector<suppWrap*,std::allocator<suppWrap*>>>
                        *)&local_b8,&local_c0);
            _n_1 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::erase(pvVar5,local_b8);
            this = std::operator<<((ostream *)&std::cout,"Not GOOD ");
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            i._0_1_ = 1;
            break;
          }
        }
        if (((byte)i & 1) == 0) {
          if (local_9c < _notGood) {
            local_1b4 = 0;
          }
          else {
            local_1b4 = local_9c - _notGood;
          }
          local_dc = local_1b4;
          sVar10 = std::
                   vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                   ::size(g);
          j = (int)sVar10;
          m = local_9c + _notGood;
          piVar8 = std::max<int>(&j,&m);
          local_e0 = *piVar8;
LAB_00a508d6:
          if (local_dc < local_e0) {
            k = 0;
            pvVar5 = std::
                     vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                     ::operator[](g,(long)local_dc);
            sVar10 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(pvVar5);
            l = (int)sVar10;
            for (; k < l; k = k + 1) {
              pvVar5 = std::
                       vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                       ::operator[](g,(long)local_dc);
              ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                   (pvVar5,(long)k);
              psVar9 = Bmatch_FindSuppWrap(&pInformation->_f_already_try,ppsVar11);
              if (psVar9 != tmpW) {
                pvVar5 = std::
                         vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                         ::operator[](g,(long)local_dc);
                ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                     (pvVar5,(long)k);
                tmpWrap2 = *ppsVar11;
                local_f4 = 0;
                sVar10 = std::
                         vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                         ::size(&pInformation->_f_already_try);
                local_f8 = (int)sVar10;
                goto LAB_00a509ac;
              }
            }
            goto LAB_00a50ab6;
          }
        }
LAB_00a50ad9:
        i._0_1_ = 0;
        if ((i._2_1_ & 1) != 0) break;
        pvVar5 = std::
                 vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 ::operator[](f,(long)local_9c);
        pvVar7 = std::
                 vector<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>,_std::allocator<std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>
                 ::operator[](f,(long)local_9c);
        local_128._M_current =
             (suppWrap **)std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::begin(pvVar7);
        __gnu_cxx::
        __normal_iterator<suppWrap*const*,std::vector<suppWrap*,std::allocator<suppWrap*>>>::
        __normal_iterator<suppWrap**>
                  ((__normal_iterator<suppWrap*const*,std::vector<suppWrap*,std::allocator<suppWrap*>>>
                    *)&local_120,&local_128);
        local_130 = (suppWrap **)
                    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::erase(pvVar5,local_120);
      }
      local_9c = local_9c + 1;
    }
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back
              ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1,&tmpWrap2);
    std::make_pair<suppWrap*&,std::vector<suppWrap*,std::allocator<suppWrap*>>&>
              ((pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> *)&n_2,&tmpW
               ,(vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
    pppsVar1 = &mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::operator=
              ((pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> *)pppsVar1,
               (type)&n_2);
    std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::~pair((type)&n_2);
    std::
    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
    ::push_back(fo,(value_type *)pppsVar1);
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::clear
              ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
    j_1 = 0;
    sVar10 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(&tmpWrap2->funSupp);
    m_1 = (int)sVar10;
    for (; j_1 < m_1; j_1 = j_1 + 1) {
      ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                           (&tmpWrap2->funSupp,(long)j_1);
      _poCap = Bmatch_FindSuppWrap(&pInformation->_x_match,ppsVar11);
      if (_poCap != (suppWrap *)0x0) {
        std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back
                  ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1,(value_type *)&poCap
                  );
        i._3_1_ = 1;
      }
      if ((i._3_1_ & 1) == 0) {
        local_15c = 0;
        sVar10 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(&tmpW->funSupp);
        local_160 = (int)sVar10;
        for (; local_15c < local_160; local_15c = local_15c + 1) {
          ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                               (&tmpW->funSupp,(long)local_15c);
          iVar2 = (*ppsVar11)->numOfInfluence;
          ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                               (&tmpWrap2->funSupp,(long)j_1);
          if ((*ppsVar11)->numOfInfluence - _notGood <= iVar2) {
            ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                 (&tmpW->funSupp,(long)local_15c);
            iVar2 = (*ppsVar11)->numOfInfluence;
            ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                 (&tmpWrap2->funSupp,(long)j_1);
            if (iVar2 <= (*ppsVar11)->numOfInfluence + _notGood) {
              ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                   (&tmpW->funSupp,(long)local_15c);
              std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back
                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1,ppsVar11);
            }
          }
        }
      }
      ppsVar11 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                           (&tmpWrap2->funSupp,(long)j_1);
      std::make_pair<suppWrap*&,std::vector<suppWrap*,std::allocator<suppWrap*>>&>
                (&local_180,ppsVar11,(vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
      pppsVar1 = &mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::operator=
                ((pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> *)pppsVar1
                 ,&local_180);
      std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::~pair
                (&local_180);
      std::
      vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
      ::push_back(gi,(value_type *)pppsVar1);
      std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::clear
                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
      i._3_1_ = 0;
    }
  }
  f_local._7_1_ = true;
LAB_00a50e19:
  n = 1;
  std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::~vector
            ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
  std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::~pair
            ((pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> *)
             &mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return f_local._7_1_;
LAB_00a509ac:
  if (local_f8 <= local_f4) goto LAB_00a50a19;
  pvVar6 = std::
           vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
           ::operator[](&pInformation->_f_already_try,(long)local_f4);
  if (pvVar6->first == tmpW) {
    pvVar6 = std::
             vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
             ::operator[](&pInformation->_f_already_try,(long)local_f4);
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back(&pvVar6->second,&tmpWrap2);
    i._1_1_ = 1;
    goto LAB_00a50a19;
  }
  local_f4 = local_f4 + 1;
  goto LAB_00a509ac;
LAB_00a50a19:
  if ((i._1_1_ & 1) == 0) {
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::push_back
              ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1,&tmpWrap2);
    std::make_pair<suppWrap*&,std::vector<suppWrap*,std::allocator<suppWrap*>>&>
              (&local_118,&tmpW,(vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
    pppsVar1 = &mapNodes.super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::operator=
              ((pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_> *)pppsVar1,
               &local_118);
    std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>::~pair(&local_118);
    std::
    vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
    ::push_back(&pInformation->_f_already_try,(value_type *)pppsVar1);
    std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::clear
              ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)&tmpWrap1);
  }
  i._1_1_ = 0;
  i._2_1_ = 1;
LAB_00a50ab6:
  if ((i._2_1_ & 1) != 0) goto LAB_00a50ad9;
  local_dc = local_dc + 1;
  goto LAB_00a508d6;
}

Assistant:

bool Bmatch_GetGuess ( vector< vector< suppWrap * > > & f,
					   vector< vector< suppWrap * > > & g,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & fo,
					   vector< pair< suppWrap *, vector< suppWrap * > > > & gi,
					   PI_PO_INFO * pInformation,
					   METHOD method )
{
	assert( !f.empty() && !g.empty() );
	pair< suppWrap *, vector< suppWrap * > > tmpPair;
	vector< suppWrap * > mapNodes;
	suppWrap * tmpWrap1, * tmpWrap2, * tmpW;
	int piCap = 3, poCap = 1, currentIndex = 0;
	bool done = false, findPair = false, save = false, notGood = false;

    //int capacity = ( Abc_NtkPoNum( tmpInformation->_cir1 ) - Abc_NtkPoNum( tmpInformation->_cir2 ) );
    //capacity = (capacity >= 0) ? capacity + 1 : 1;

	switch( method ) {
		case M_ONE_TO_ONE:
            while( !findPair ) {
                if( currentIndex == f.size() ) return false;
                else { 
                    while( !f[currentIndex].empty() ){
                        tmpWrap2 = f[currentIndex][0];
                        for( int i = 0, n = pInformation->_f_match.size(); i < n; ++i ) {
                            if( tmpWrap2 == pInformation->_f_match[i].first ) {
                                f[currentIndex].erase(f[currentIndex].begin());
                    cout << "Not GOOD " << endl;
                                notGood = true;
                                break;
                            }
                        }
                        if( !notGood ) {
                        for( int i = (currentIndex >= poCap) ? currentIndex - poCap : 0,
                                 n = max((int)g.size(), currentIndex + poCap); i < n; ++i ) {
                            for( int j = 0, m = g[i].size(); j < m; ++j ) {
                                if( !(Bmatch_FindSuppWrap( pInformation->_f_already_try, g[i][j] ) == tmpWrap2) ) {
                                    tmpWrap1 = g[i][j];

                                    for( int k = 0, l = pInformation->_f_already_try.size(); k < l; ++k ) {
                                        if( pInformation->_f_already_try[k].first == tmpWrap2 ) {
                                            pInformation->_f_already_try[k].second.push_back(tmpWrap1);
                                            save = true;
                                            break;
                                        }
                                    }
                                    if( !save ) {
                                        mapNodes.push_back(tmpWrap1);
                                        tmpPair = make_pair(tmpWrap2, mapNodes);
                                        pInformation->_f_already_try.push_back(tmpPair);
                                        mapNodes.clear();
                                    }
                                    save = false;
                                    findPair = true;
                                    break;
                                }
                            }
                            if( findPair ) break;
                        }
                        }
                        notGood = false;
                        if( !findPair ) {
                            f[currentIndex].erase(f[currentIndex].begin());
                        }
                        else break;
                    }
                }
                ++currentIndex;
            }
            //
			// tmpWrap1 = g[0][0]; tmpWrap2 = f[0][0];
			mapNodes.push_back( tmpWrap1 );
			tmpPair = make_pair( tmpWrap2, mapNodes );
			fo.push_back(tmpPair);

			mapNodes.clear();
			for( int i = 0, n = tmpWrap1->funSupp.size(); i < n; ++i ) {
				tmpW = Bmatch_FindSuppWrap( pInformation->_x_match, tmpWrap1->funSupp[i] );
				if( tmpW != NULL ) {
					mapNodes.push_back( tmpW );
					done = true;
				}
				if( !done ) {
					for( int j = 0, m = tmpWrap2->funSupp.size(); j < m; ++j ) {
						if( tmpWrap2->funSupp[j]->numOfInfluence >= tmpWrap1->funSupp[i]->numOfInfluence - poCap &&
							tmpWrap2->funSupp[j]->numOfInfluence <= tmpWrap1->funSupp[i]->numOfInfluence + poCap ) {
							mapNodes.push_back( tmpWrap2->funSupp[j] );
						}
					}
				}
				tmpPair = make_pair( tmpWrap1->funSupp[i], mapNodes );
				gi.push_back(tmpPair);
				mapNodes.clear();
				done = false;
			}
            //
		break;
		default:
		break;
	}
    return true;
}